

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O3

ion_err_t linear_hash_write_state(linear_hash_table_t *linear_hash)

{
  int iVar1;
  array_list_t *paVar2;
  ion_fpos_t *__src;
  FILE *__s;
  long lVar3;
  size_t sVar4;
  long lVar5;
  ion_err_t iVar6;
  undefined1 *__s_00;
  undefined8 uStack_30;
  
  uStack_30 = 0x10c3ee;
  sVar4 = fwrite(&linear_hash->initial_size,4,1,(FILE *)linear_hash->state);
  iVar6 = '\a';
  if (sVar4 == 1) {
    uStack_30 = 0x10c412;
    sVar4 = fwrite(&linear_hash->next_split,4,1,(FILE *)linear_hash->state);
    if (sVar4 == 1) {
      uStack_30 = 0x10c433;
      sVar4 = fwrite(&linear_hash->split_threshold,4,1,(FILE *)linear_hash->state);
      if (sVar4 == 1) {
        uStack_30 = 0x10c454;
        sVar4 = fwrite(&linear_hash->num_buckets,4,1,(FILE *)linear_hash->state);
        if (sVar4 == 1) {
          uStack_30 = 0x10c475;
          sVar4 = fwrite(&linear_hash->num_records,4,1,(FILE *)linear_hash->state);
          if (sVar4 == 1) {
            uStack_30 = 0x10c496;
            sVar4 = fwrite(&linear_hash->records_per_bucket,4,1,(FILE *)linear_hash->state);
            if (sVar4 == 1) {
              uStack_30 = 0x10c4b7;
              sVar4 = fwrite(linear_hash->bucket_map,4,1,(FILE *)linear_hash->state);
              if (sVar4 == 1) {
                paVar2 = linear_hash->bucket_map;
                lVar5 = (long)paVar2->current_size;
                lVar3 = -(lVar5 * 8 + 0xfU & 0xfffffffffffffff0);
                __s_00 = &stack0xffffffffffffffd8 + lVar3;
                *(undefined8 *)((long)&uStack_30 + lVar3) = 0x10c4eb;
                memset(__s_00,0,lVar5 << 3);
                __src = paVar2->data;
                iVar1 = linear_hash->num_buckets;
                *(undefined8 *)((long)&uStack_30 + lVar3) = 0x10c500;
                memcpy(__s_00,__src,(long)iVar1 << 3);
                __s = (FILE *)linear_hash->state;
                *(undefined8 *)((long)&uStack_30 + lVar3) = 0x10c516;
                sVar4 = fwrite(__s_00,8,1,__s);
                iVar6 = '\a';
                if (sVar4 == 1) {
                  iVar6 = '\0';
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar6;
}

Assistant:

ion_err_t
linear_hash_write_state(
	linear_hash_table_t *linear_hash
) {
	if (1 != fwrite(&linear_hash->initial_size, sizeof(linear_hash->initial_size), 1, linear_hash->state)) {
		return err_file_write_error;
	}

	if (1 != fwrite(&linear_hash->next_split, sizeof(linear_hash->next_split), 1, linear_hash->state)) {
		return err_file_write_error;
	}

	if (1 != fwrite(&linear_hash->split_threshold, sizeof(linear_hash->split_threshold), 1, linear_hash->state)) {
		return err_file_write_error;
	}

	if (1 != fwrite(&linear_hash->num_buckets, sizeof(linear_hash->num_buckets), 1, linear_hash->state)) {
		return err_file_write_error;
	}

	if (1 != fwrite(&linear_hash->num_records, sizeof(linear_hash->num_records), 1, linear_hash->state)) {
		return err_file_write_error;
	}

	if (1 != fwrite(&linear_hash->records_per_bucket, sizeof(linear_hash->records_per_bucket), 1, linear_hash->state)) {
		return err_file_write_error;
	}

	if (1 != fwrite(&linear_hash->bucket_map->current_size, sizeof(int), 1, linear_hash->state)) {
		return err_file_write_error;
	}

	ion_byte_t *cached_bucket_map = alloca(sizeof(ion_fpos_t) * linear_hash->bucket_map->current_size);

	memset(cached_bucket_map, 0, sizeof(ion_fpos_t) * linear_hash->bucket_map->current_size);
	memcpy(cached_bucket_map, linear_hash->bucket_map->data, linear_hash->num_buckets * sizeof(ion_fpos_t));

	if (1 != fwrite(cached_bucket_map, sizeof(linear_hash->bucket_map->data), 1, linear_hash->state)) {
		return err_file_write_error;
	}

	return err_ok;
}